

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.h
# Opt level: O2

void __thiscall
DIS::LinearSegmentParameter::LinearSegmentParameter
          (LinearSegmentParameter *this,LinearSegmentParameter *param_2)

{
  double dVar1;
  float fVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  
  this->_vptr_LinearSegmentParameter = (_func_int **)&PTR__LinearSegmentParameter_001b1658;
  this->_segmentNumber = param_2->_segmentNumber;
  (this->_segmentAppearance)._vptr_SixByteChunk = (_func_int **)&PTR__SixByteChunk_001b2300;
  *(undefined4 *)(this->_segmentAppearance)._otherParameters =
       *(undefined4 *)(param_2->_segmentAppearance)._otherParameters;
  *(undefined2 *)((this->_segmentAppearance)._otherParameters + 4) =
       *(undefined2 *)((param_2->_segmentAppearance)._otherParameters + 4);
  (this->_location)._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001b2778;
  dVar1 = (param_2->_location)._y;
  (this->_location)._x = (param_2->_location)._x;
  (this->_location)._y = dVar1;
  (this->_location)._z = (param_2->_location)._z;
  (this->_orientation)._vptr_Orientation = (_func_int **)&PTR__Orientation_001b1a40;
  fVar2 = (param_2->_orientation)._theta;
  (this->_orientation)._psi = (param_2->_orientation)._psi;
  (this->_orientation)._theta = fVar2;
  (this->_orientation)._phi = (param_2->_orientation)._phi;
  uVar3 = param_2->_segmentWidth;
  uVar4 = param_2->_segmentHeight;
  uVar5 = param_2->_segmentDepth;
  this->_segmentLength = param_2->_segmentLength;
  this->_segmentWidth = uVar3;
  this->_segmentHeight = uVar4;
  this->_segmentDepth = uVar5;
  this->_pad1 = param_2->_pad1;
  return;
}

Assistant:

class OPENDIS6_EXPORT LinearSegmentParameter
{
protected:
  /** number of segments */
  unsigned char _segmentNumber; 

  /** segment appearance */
  SixByteChunk _segmentAppearance; 

  /** location */
  Vector3Double _location; 

  /** orientation */
  Orientation _orientation; 

  /** segmentLength */
  unsigned short _segmentLength; 

  /** segmentWidth */
  unsigned short _segmentWidth; 

  /** segmentHeight */
  unsigned short _segmentHeight; 

  /** segment Depth */
  unsigned short _segmentDepth; 

  /** segment Depth */
  unsigned int _pad1; 


 public:
    LinearSegmentParameter();
    virtual ~LinearSegmentParameter();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getSegmentNumber() const; 
    void setSegmentNumber(unsigned char pX); 

    SixByteChunk& getSegmentAppearance(); 
    const SixByteChunk&  getSegmentAppearance() const; 
    void setSegmentAppearance(const SixByteChunk    &pX);

    Vector3Double& getLocation(); 
    const Vector3Double&  getLocation() const; 
    void setLocation(const Vector3Double    &pX);

    Orientation& getOrientation(); 
    const Orientation&  getOrientation() const; 
    void setOrientation(const Orientation    &pX);

    unsigned short getSegmentLength() const; 
    void setSegmentLength(unsigned short pX); 

    unsigned short getSegmentWidth() const; 
    void setSegmentWidth(unsigned short pX); 

    unsigned short getSegmentHeight() const; 
    void setSegmentHeight(unsigned short pX); 

    unsigned short getSegmentDepth() const; 
    void setSegmentDepth(unsigned short pX); 

    unsigned int getPad1() const; 
    void setPad1(unsigned int pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const LinearSegmentParameter& rhs) const;
}